

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenko::BuildBeam
          (ChBuilderBeamTaperedTimoshenko *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *sect,int N,
          ChVector<double> *A,ChVector<double> *B,ChVector<double> *Ydir)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  ChMesh *pCVar1;
  pointer psVar2;
  ChNodeFEAxyzrot *pCVar3;
  ChElementBeamTaperedTimoshenko *this_01;
  ChVector<double> *pCVar4;
  value_type *__x;
  long lVar5;
  int iVar6;
  double dVar7;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  ChVector<double> mZ;
  ChVector<double> mX;
  ChVector<double> mY;
  ChMatrix33<double> mrot;
  value_type local_278;
  element_type *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  undefined8 local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  undefined8 local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  shared_ptr<chrono::fea::ChElementBase> local_238;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_228;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_218;
  ChVector<double> local_208;
  ChVector<double> local_1e8;
  long local_1c8;
  double local_1c0;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *local_1b8;
  ChBuilderBeamTaperedTimoshenko *local_1b0;
  _func_int **local_1a8;
  ChVector<double> *local_1a0;
  ChFrame<double> local_198;
  ChFrame<double> local_108;
  ChMatrix33<double> local_78;
  
  local_1b8 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_1b0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  local_208.m_data[0] = B->m_data[0] - A->m_data[0];
  local_208.m_data[1] = B->m_data[1] - A->m_data[1];
  local_208.m_data[2] = B->m_data[2] - A->m_data[2];
  local_198.coord.pos.m_data[1] = 0.0;
  local_198._vptr_ChFrame = (_func_int **)0x0;
  local_198.coord.pos.m_data[0] = 0.0;
  local_108.coord.pos.m_data[1] = 0.0;
  local_108._vptr_ChFrame = (_func_int **)0x0;
  local_108.coord.pos.m_data[0] = 0.0;
  local_1e8.m_data[2] = 0.0;
  local_1e8.m_data[0] = 0.0;
  local_1e8.m_data[1] = 0.0;
  local_1a0 = B;
  ChVector<double>::DirToDxDyDz
            (&local_208,(ChVector<double> *)&local_198,(ChVector<double> *)&local_108,&local_1e8,
             Ydir);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_198._vptr_ChFrame;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_108._vptr_ChFrame;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1e8.m_data[0];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_198.coord.pos.m_data[0];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_108.coord.pos.m_data[0];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1e8.m_data[1];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_198.coord.pos.m_data[1];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_108.coord.pos.m_data[1];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1e8.m_data[2];
  pCVar4 = A;
  ChFrame<double>::ChFrame(&local_108,A,&local_78);
  pCVar3 = (ChNodeFEAxyzrot *)ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)pCVar4)
  ;
  local_1a8 = (_func_int **)&PTR__ChFrame_00b2b308;
  local_198._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_198.coord.pos.m_data[0] = local_108.coord.pos.m_data[0];
  local_198.coord.pos.m_data[1] = local_108.coord.pos.m_data[1];
  local_198.coord.pos.m_data[2] = local_108.coord.pos.m_data[2];
  local_198.coord.rot.m_data[0] = local_108.coord.rot.m_data[0];
  local_198.coord.rot.m_data[1] = local_108.coord.rot.m_data[1];
  local_198.coord.rot.m_data[2] = local_108.coord.rot.m_data[2];
  local_198.coord.rot.m_data[3] = local_108.coord.rot.m_data[3];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar3,&local_198);
  local_208.m_data[0] = (double)pCVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208.m_data + 1),pCVar3);
  pCVar1 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_218.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_208.m_data[0];
  local_218.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208.m_data[1];
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)((long)local_208.m_data[1] + 8) =
           *(_Atomic_word *)((long)local_208.m_data[1] + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)((long)local_208.m_data[1] + 8) =
           *(_Atomic_word *)((long)local_208.m_data[1] + 8) + 1;
    }
  }
  ChMesh::AddNode(pCVar1,&local_218);
  if (local_218.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,(value_type *)&local_208);
  if (0 < N) {
    local_1c0 = (double)N;
    local_1c8 = (ulong)(uint)N << 4;
    iVar6 = 1;
    lVar5 = 0;
    do {
      dVar7 = (double)iVar6 / local_1c0;
      local_1e8.m_data[0] = A->m_data[0] + dVar7 * (local_1a0->m_data[0] - A->m_data[0]);
      local_1e8.m_data[1] = A->m_data[1] + dVar7 * (local_1a0->m_data[1] - A->m_data[1]);
      local_1e8.m_data[2] = A->m_data[2] + dVar7 * (local_1a0->m_data[2] - A->m_data[2]);
      pCVar4 = &local_1e8;
      ChFrame<double>::ChFrame(&local_108,pCVar4,&local_78);
      pCVar3 = (ChNodeFEAxyzrot *)
               ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)pCVar4);
      local_198._vptr_ChFrame = local_1a8;
      local_198.coord.pos.m_data[0] = local_108.coord.pos.m_data[0];
      local_198.coord.pos.m_data[1] = local_108.coord.pos.m_data[1];
      local_198.coord.pos.m_data[2] = local_108.coord.pos.m_data[2];
      local_198.coord.rot.m_data[0] = local_108.coord.rot.m_data[0];
      local_198.coord.rot.m_data[1] = local_108.coord.rot.m_data[1];
      local_198.coord.rot.m_data[2] = local_108.coord.rot.m_data[2];
      local_198.coord.rot.m_data[3] = local_108.coord.rot.m_data[3];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_108.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar3,&local_198);
      local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = pCVar3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                (&local_278.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pCVar3);
      pCVar1 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_228.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_ChNodeFEAbase;
      local_228.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_278.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_278.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar1,&local_228);
      if (local_228.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __x = &local_278;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_00,__x);
      this_01 = (ChElementBeamTaperedTimoshenko *)
                ChElementBeamTaperedTimoshenko::operator_new
                          ((ChElementBeamTaperedTimoshenko *)0x238,(size_t)__x);
      ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko(this_01);
      local_198._vptr_ChFrame = (_func_int **)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamTaperedTimoshenko*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198.coord,this_01);
      pCVar1 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_238.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_198._vptr_ChFrame;
      local_238.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar1,&local_238);
      if (local_238.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_238.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
      ::push_back(&local_1b0->beam_elems,(value_type *)&local_198);
      psVar2 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_248 = *(undefined8 *)
                   ((long)&(psVar2->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar5);
      local_240 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar2->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_refcount._M_pi + lVar5);
      if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_240->_M_use_count = local_240->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_240->_M_use_count = local_240->_M_use_count + 1;
        }
      }
      psVar2 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_258 = *(undefined8 *)
                   ((long)&psVar2[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar5);
      local_250 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&psVar2[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar5);
      if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_250->_M_use_count = local_250->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_250->_M_use_count = local_250->_M_use_count + 1;
        }
      }
      (*(((ChElementBeam *)local_198._vptr_ChFrame)->super_ChElementGeneric).super_ChElementBase.
        _vptr_ChElementBase[0x1a])(local_198._vptr_ChFrame,&local_248,&local_258);
      if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
      }
      if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
      }
      local_268 = (local_1b8->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_260._M_pi =
           (local_1b8->
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
        }
      }
      (((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
       ((long)local_198._vptr_ChFrame + 200))->
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = local_268;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
                   ((long)local_198._vptr_ChFrame + 200))->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_260);
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0]);
      }
      if (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_278.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar6 = iVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (local_1c8 != lVar5);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208.m_data[1]);
  }
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenko::BuildBeam(
    std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGeneric> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   const ChVector<> A,                        // starting point
                                   const ChVector<> B,                        // ending point
                                   const ChVector<> Ydir                      // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - A, Ydir);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(A, mrot));
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenko>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        element->SetTaperedSection(sect);
    }
}